

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_task.c
# Opt level: O0

void s_task_next(s_awaiter_t *__awaiter_dummy__)

{
  long *in_FS_OFFSET;
  s_awaiter_t *__awaiter_dummy___local;
  
  *(undefined1 *)(*(long *)(*in_FS_OFFSET + -0xe8) + 0x50) = 0;
  s_timer_run();
  s_task_call_next(__awaiter_dummy__);
  return;
}

Assistant:

void s_task_next(__async__) {
    g_globals.current_task->waiting_cancelled = false;
    s_timer_run();
    s_task_call_next(__await__);
}